

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execNegEa<(moira::Instr)84,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  u32 data;
  u32 ea;
  u32 local_10;
  u32 local_c;
  
  bVar1 = readOp<(moira::Mode)2,(moira::Size)2,0ul>(this,opcode & 7,&local_c,&local_10);
  if (bVar1) {
    local_10 = logic<(moira::Instr)84,(moira::Size)2>(this,local_10);
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,local_c,local_10);
  }
  return;
}

Assistant:

void
Moira::execNegEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S,STD_AE_FRAME>(dst, ea, data)) return;
    
    data = logic<I,S>(data);
    prefetch();

    writeOp<M,S,POLLIPL>(dst, ea, data);
}